

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringRef __thiscall
Catch::Capturer::Capturer::anon_class_8_1_a855c668::operator()
          (anon_class_8_1_a855c668 *this,size_t start,size_t end)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  StringRef SVar5;
  size_type local_30;
  size_t end_local;
  size_t start_local;
  anon_class_8_1_a855c668 *this_local;
  
  end_local = start;
  while( true ) {
    cVar1 = StringRef::operator[](this->names,end_local);
    bVar4 = true;
    if (cVar1 != ',') {
      bVar2 = StringRef::operator[](this->names,end_local);
      iVar3 = isspace((uint)bVar2);
      bVar4 = iVar3 != 0;
    }
    local_30 = end;
    if (!bVar4) break;
    end_local = end_local + 1;
  }
  while( true ) {
    cVar1 = StringRef::operator[](this->names,local_30);
    bVar4 = true;
    if (cVar1 != ',') {
      bVar2 = StringRef::operator[](this->names,local_30);
      iVar3 = isspace((uint)bVar2);
      bVar4 = iVar3 != 0;
    }
    if (!bVar4) break;
    local_30 = local_30 - 1;
  }
  SVar5 = StringRef::substr(this->names,end_local,(local_30 - end_local) + 1);
  return SVar5;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }